

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_rendering_info
          (Impl *this,Value *state,VkPipelineRenderingCreateInfoKHR **out_info)

{
  bool bVar1;
  VkFormat VVar2;
  uint uVar3;
  SizeType SVar4;
  VkPipelineRenderingCreateInfo *pVVar5;
  Type pGVar6;
  
  pVVar5 = ScratchAllocator::allocate_cleared<VkPipelineRenderingCreateInfo>(&this->allocator);
  *out_info = pVVar5;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthAttachmentFormat");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar6);
  pVVar5->depthAttachmentFormat = VVar2;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"stencilAttachmentFormat");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar6);
  pVVar5->stencilAttachmentFormat = VVar2;
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"viewMask");
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar6);
  pVVar5->viewMask = uVar3;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"colorAttachmentFormats");
  if (bVar1) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"colorAttachmentFormats");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    pVVar5->colorAttachmentCount = SVar4;
    parse_uints(this,pGVar6,&pVVar5->pColorAttachmentFormats);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_rendering_info(const Value &state,
                                                        VkPipelineRenderingCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRenderingCreateInfoKHR>();
	*out_info = info;

	info->depthAttachmentFormat = static_cast<VkFormat>(state["depthAttachmentFormat"].GetUint());
	info->stencilAttachmentFormat = static_cast<VkFormat>(state["stencilAttachmentFormat"].GetUint());
	info->viewMask = state["viewMask"].GetUint();

	if (state.HasMember("colorAttachmentFormats"))
	{
		auto &atts = state["colorAttachmentFormats"];
		info->colorAttachmentCount = atts.Size();
		static_assert(sizeof(VkFormat) == sizeof(uint32_t), "Enum size is not 32-bit.");
		if (!parse_uints(atts, reinterpret_cast<const uint32_t **>(&info->pColorAttachmentFormats)))
			return false;
	}

	return true;
}